

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::BadNameString::~BadNameString(BadNameString *this)

{
  Error::~Error((Error *)this);
  operator_delete(this);
  return;
}

Assistant:

static BadNameString OneCharName(std::string name) { return BadNameString("Invalid one char name: " + name); }